

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O2

nh_bool ext_cmd_getlin_hook(char *base,void *hook_arg)

{
  char *__s2;
  nh_bool nVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)*(uint *)((long)hook_arg + 0x10);
  if ((int)*(uint *)((long)hook_arg + 0x10) < 1) {
    uVar4 = uVar5;
  }
  uVar3 = 0xffffffffffffffff;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    __s2 = *(char **)(*hook_arg + uVar5 * 8);
    __n = strlen(base);
    iVar2 = strncasecmp(base,__s2,__n);
    if (iVar2 == 0) {
      if ((int)uVar3 != -1) goto LAB_00109f8a;
      uVar3 = uVar5 & 0xffffffff;
    }
  }
  if ((int)uVar3 < 0) {
LAB_00109f8a:
    nVar1 = '\0';
  }
  else {
    strcpy(base,*(char **)(*hook_arg + (uVar3 & 0xffffffff) * 8));
    nVar1 = '\x01';
  }
  return nVar1;
}

Assistant:

static nh_bool ext_cmd_getlin_hook(char *base, void *hook_arg)
{
    int oindex, com_index;
    struct extcmd_hook_args *hpa = hook_arg;

    com_index = -1;
    for (oindex = 0; oindex < hpa->listlen; oindex++) {
	if (!strncasecmp(base, hpa->namelist[oindex], strlen(base))) {
	    if (com_index == -1)	/* no matches yet */
		com_index = oindex;
	    else			/* more than 1 match */
		return FALSE;
	}
    }
    if (com_index >= 0) {
	strcpy(base, hpa->namelist[com_index]);
	return TRUE;
    }

    return FALSE;	/* didn't match anything */
}